

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_NtkOptNodeAnalyze
               (Acb_Mfs_t *p,int PivotVar,int nDivs,int nValues,int *pValues,Vec_Int_t *vSupp)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  word Diffs [64];
  word OffSet [64];
  word OnSet [64];
  int *local_680;
  ulong local_638 [64];
  ulong local_438 [64];
  ulong local_238 [65];
  
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  memset(local_638,0,0x200);
  iVar2 = nDivs * 2 + 1;
  uVar18 = (long)nValues / (long)iVar2;
  iVar12 = (int)uVar18;
  uVar9 = (ulong)(nDivs - 0x40);
  if (nDivs < 0x40) {
    uVar9 = 0;
  }
  uVar11 = 0x40;
  if (nDivs < 0x40) {
    uVar11 = nDivs;
  }
  if (nValues % iVar2 != 0) {
    __assert_fail("nValues % nScope == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x4d4,
                  "void Acb_NtkOptNodeAnalyze(Acb_Mfs_t *, int, int, int, int *, Vec_Int_t *)");
  }
  if (0x10 < iVar12) {
    __assert_fail("nFrames <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x4d5,
                  "void Acb_NtkOptNodeAnalyze(Acb_Mfs_t *, int, int, int, int *, Vec_Int_t *)");
  }
  iVar7 = (int)uVar9;
  if (iVar12 < 1) {
    uVar17 = 0;
  }
  else {
    uVar10 = 0x40;
    if (0x40 < nDivs) {
      uVar10 = (ulong)(uint)nDivs;
    }
    uVar13 = uVar18 & 0xffffffff;
    local_680 = pValues + (uVar10 - 0x3f);
    lVar6 = (uVar11 - uVar10) + 0x40;
    cVar1 = ((char)uVar10 - (char)uVar9) + -0x40;
    uVar10 = 0;
    do {
      iVar16 = 0;
      iVar15 = nDivs;
      if (pValues[uVar10 * (long)iVar2] == 0) {
        iVar15 = 0;
        iVar16 = nDivs;
      }
      printf("%2d:",uVar10 & 0xffffffff);
      if (iVar7 < (int)uVar11) {
        lVar14 = 0;
        do {
          printf("%d",(ulong)(uint)local_680[iVar16 + lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar6 != lVar14);
        putchar(10);
        printf("%2d:",uVar10 & 0xffffffff);
        if ((int)uVar11 <= iVar7) goto LAB_003a6a21;
        lVar14 = 0;
        do {
          printf("%d",(ulong)(uint)local_680[iVar15 + lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar6 != lVar14);
        putchar(10);
        if (iVar7 < (int)uVar11) {
          lVar14 = 0;
          do {
            if (local_680[iVar16 + lVar14] != 0) {
              local_238[uVar10] = local_238[uVar10] | 1L << (cVar1 + (char)lVar14 & 0x3fU);
            }
            if (local_680[iVar15 + lVar14] != 0) {
              local_438[uVar10] = local_438[uVar10] | 1L << (cVar1 + (char)lVar14 & 0x3fU);
            }
            lVar14 = lVar14 + 1;
          } while (lVar6 != lVar14);
        }
      }
      else {
        putchar(10);
        printf("%2d:",uVar10 & 0xffffffff);
LAB_003a6a21:
        putchar(10);
      }
      uVar10 = uVar10 + 1;
      local_680 = local_680 + (long)(nDivs * 2) + 1;
    } while (uVar10 != uVar13);
    if (iVar12 < 1) {
      uVar17 = 0;
    }
    else {
      uVar10 = 0;
      uVar17 = 0;
      do {
        uVar3 = 0;
        do {
          if ((int)uVar17 < 1) {
            uVar5 = 0;
          }
          else {
            uVar4 = 0;
            do {
              uVar5 = uVar4;
              if (local_638[uVar4] == (local_438[uVar3] ^ local_238[uVar10])) break;
              uVar4 = uVar4 + 1;
              uVar5 = (ulong)uVar17;
            } while (uVar17 != uVar4);
          }
          if ((int)uVar17 < 0x40 && (int)uVar17 <= (int)uVar5) {
            lVar6 = (long)(int)uVar17;
            uVar17 = uVar17 + 1;
            local_638[lVar6] = local_438[uVar3] ^ local_238[uVar10];
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar13);
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar13);
    }
  }
  printf("Divisors = %d.  Frames = %d.  Patterns = %d.\n",(ulong)(uint)nDivs,uVar18 & 0xffffffff,
         (ulong)uVar17);
  printf("   ");
  uVar18 = uVar9;
  if (iVar7 < (int)uVar11) {
    do {
      printf("%d",uVar18 / 10);
      uVar8 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar8;
    } while ((int)uVar8 < (int)uVar11);
    putchar(10);
    printf("   ");
    uVar18 = uVar9;
    if ((int)uVar11 <= iVar7) {
      putchar(10);
      printf("   ");
      goto LAB_003a6c36;
    }
    do {
      printf("%d",(ulong)(uint)((int)uVar18 + (int)(uVar18 / 10) * -10));
      uVar8 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar8;
    } while ((int)uVar8 < (int)uVar11);
  }
  else {
    putchar(10);
    printf("   ");
  }
  putchar(10);
  printf("   ");
  if (iVar7 < (int)uVar11) {
LAB_003a6bd1:
    lVar6 = (long)vSupp->nSize;
    iVar12 = 0x20;
    iVar2 = (int)uVar9;
    if (0 < lVar6) {
      lVar14 = 0;
      do {
        if (vSupp->pArray[lVar14] == iVar2) {
          lVar14 = 0;
          goto LAB_003a6bf7;
        }
        lVar14 = lVar14 + 1;
      } while (lVar6 != lVar14);
    }
    goto LAB_003a6c0f;
  }
LAB_003a6c36:
  putchar(10);
  if (0 < (int)uVar17) {
    uVar18 = 0;
    do {
      printf("%2d:",uVar18 & 0xffffffff);
      if (0 < nDivs) {
        uVar9 = local_638[uVar18];
        uVar10 = 0;
        do {
          iVar12 = 0x2a;
          if ((uVar9 >> (uVar10 & 0x3f) & 1) == 0) {
            iVar12 = 0x20;
          }
          putchar(iVar12);
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      putchar(10);
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar17);
  }
  return;
  while (lVar14 = lVar14 + 1, lVar6 != lVar14) {
LAB_003a6bf7:
    if (vSupp->pArray[lVar14] == iVar2) {
      iVar12 = (int)lVar14 + 0x61;
      goto LAB_003a6c0f;
    }
  }
  iVar12 = 0x60;
LAB_003a6c0f:
  putchar(iVar12);
  uVar9 = (ulong)(iVar2 + 1U);
  if ((int)uVar11 <= (int)(iVar2 + 1U)) goto LAB_003a6c36;
  goto LAB_003a6bd1;
}

Assistant:

void Acb_NtkOptNodeAnalyze( Acb_Mfs_t * p, int PivotVar, int nDivs, int nValues, int * pValues, Vec_Int_t * vSupp )
{
    word OnSet[64] = {0};
    word OffSet[64] = {0};
    word Diffs[64] = {0};
    int s, nScope = 1 + 2*nDivs, d, i;
    int f, nFrames = nValues / nScope;
    int start = nDivs < 64 ? 0 : nDivs - 64;
    int stop  = nDivs < 64 ? nDivs : 64;
    assert( nValues % nScope == 0 );
    assert( nFrames <= 16 );
    for ( f = 0; f < nFrames; f++ )
    {
        int * pStart  = pValues + f * nScope;
        int * pOnSet  = pStart + 1 + (pStart[0] ? 0 : nDivs);
        int * pOffSet = pStart + 1 + (pStart[0] ? nDivs : 0);

        printf( "%2d:", f );
        for ( s = start; s < stop; s++ )
            printf( "%d", pOnSet[s] );
        printf( "\n" );

        printf( "%2d:", f );
        for ( s = start; s < stop; s++ )
            printf( "%d", pOffSet[s] );
        printf( "\n" );

        for ( s = start; s < stop; s++ )
        {
            if ( pOnSet[s] )   OnSet[f]  |= (((word)1) << (s-start));
            if ( pOffSet[s] )  OffSet[f] |= (((word)1) << (s-start));
        }
    }
    d = 0;
    for ( f = 0; f < nFrames; f++ )
    for ( s = 0; s < nFrames; s++ )
    {
        for ( i = 0; i < d; i++ )
            if ( Diffs[i] == (OnSet[f] ^ OffSet[s]) )
                break;
        if ( i < d )
            continue;
        if ( d < 64 )
            Diffs[d++] = OnSet[f] ^ OffSet[s];
    }

    printf( "Divisors = %d.  Frames = %d.  Patterns = %d.\n", nDivs, nFrames, d );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%d", s / 10 );
    printf( "\n" );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%d", s % 10 );
    printf( "\n" );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%c", Vec_IntFind(vSupp, s) >= 0 ? 'a' + Vec_IntFind(vSupp, s) : ' ' );
    printf( "\n" );
    for ( s = 0; s < d; s++ )
    {
        printf( "%2d:", s );
        for ( f = 0; f < stop; f++ )
            printf( "%c", ((Diffs[s] >> f) & 1) ? '*' : ' ' );
        printf( "\n" );
    }
}